

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

Index __thiscall
BayesianGameCollaborativeGraphical::JointToGroupTypeIndex
          (BayesianGameCollaborativeGraphical *this,Index e,Index jtI)

{
  Index IVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIndices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> restrictedIndivTypes;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  indivIndices = BayesianGameBase::JointToIndividualTypeIndices((BayesianGameBase *)this,jtI);
  RestrictIndividualIndicesToScope<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,this,indivIndices,e);
  IVar1 = BayesianGameBase::IndividualToJointTypeIndices
                    ((BayesianGameBase *)
                     (this->_m_LRFs).
                     super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[e],
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  return IVar1;
}

Assistant:

Index  BayesianGameCollaborativeGraphical::
JointToGroupTypeIndex(Index e, Index jtI) const
{
    const vector<Index> &indTypes = JointToIndividualTypeIndices(jtI);
    vector<Index> restrictedIndivTypes = RestrictIndividualIndicesToScope(
            indTypes, e);    
    Index jtGI = _m_LRFs[e]->
        IndividualToJointTypeIndices(restrictedIndivTypes);
    return(jtGI);
}